

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O3

Value * apply_exponent_operation(Value *left_value,Value *right_value)

{
  Value *pVVar1;
  longdouble lVar2;
  longdouble lVar3;
  double __x;
  double dVar4;
  double dVar5;
  
  if (((left_value->value_type & ~ValueTypeBoolValue) != ValueTypeIntegerValue) ||
     ((right_value->value_type & ~ValueTypeBoolValue) != ValueTypeIntegerValue)) {
    pVVar1 = new_null_value();
    return pVVar1;
  }
  if (left_value->value_type == ValueTypeFloatValue) {
    lVar2 = *(longdouble *)&left_value[1].linked_variable_count;
  }
  else {
    lVar2 = (longdouble)*(long *)(left_value + 1);
  }
  if (right_value->value_type == ValueTypeFloatValue) {
    lVar3 = *(longdouble *)&right_value[1].linked_variable_count;
  }
  else {
    lVar3 = (longdouble)*(long *)(right_value + 1);
  }
  __x = pow((double)lVar2,(double)lVar3);
  dVar4 = ceil(__x);
  dVar5 = floor(__x);
  if ((dVar4 == dVar5) && (!NAN(dVar4) && !NAN(dVar5))) {
    pVVar1 = new_integer_value((long)__x);
    return pVVar1;
  }
  pVVar1 = new_float_value((longdouble)__x);
  return pVVar1;
}

Assistant:

Value *apply_exponent_operation(Value *left_value, Value *right_value) {
  if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float, result;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    result = pow(left_float, right_float);

    if (ceil(result) == floor(result)) {
      return new_integer_value((long long int) result);
    }
    else {
      return new_float_value(result);
    }
  }

  return new_null_value();
}